

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  uint uVar2;
  int lvalue;
  object l_init;
  functor j_init;
  undefined1 local_45a;
  undefined1 local_459;
  shared_ptr<object> local_458;
  fn l;
  fn m;
  fn k;
  fn j;
  fn i;
  fn h;
  fn g;
  fn f;
  fn e;
  fn d;
  fn c;
  fn b;
  fn a;
  
  lvalue = 0;
  a.m_empty = false;
  a.m_storage._8_8_ = functor::operator();
  a.m_storage._16_8_ = 0;
  a.m_deleter = tmf::callable<int(int&,int),32ul>::callable<functor>(functor&&)::{lambda(auto:1)#1}
                ::callable_base<int,int&,int>_const__;
  a.m_caller = tmf::callable<int(int&,int),32ul>::callable<functor>(functor&&)::
               {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  a.m_copier = tmf::callable<int(int&,int),32ul>::callable<functor>(functor&&)::
               {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  a.m_mover = tmf::callable<int(int&,int),32ul>::callable<functor>(functor&&)::
              {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  b.m_deleter = (deleter_function_pointer)CONCAT44(b.m_deleter._4_4_,1);
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)&a,&lvalue,(int *)&b);
  if (iVar1 != 1) {
    std::operator<<((ostream *)&std::cout,"call test: step 1 failed!\n");
  }
  uVar2 = (uint)(iVar1 != 1);
  b.m_empty = false;
  b.m_storage._0_8_ = &local_459;
  b.m_storage._8_8_ = functor::operator();
  b.m_storage._16_8_ = 0;
  b.m_deleter = tmf::callable<int(int&,int),32ul>::callable<functor&>(functor&)::{lambda(auto:1)#1}
                ::callable_base<int,int&,int>_const__;
  b.m_caller = tmf::callable<int(int&,int),32ul>::callable<functor&>(functor&)::
               {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  b.m_copier = tmf::callable<int(int&,int),32ul>::callable<functor&>(functor&)::
               {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  b.m_mover = tmf::callable<int(int&,int),32ul>::callable<functor&>(functor&)::
              {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  c.m_deleter = (deleter_function_pointer)CONCAT44(c.m_deleter._4_4_,2);
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)&b,&lvalue,(int *)&c);
  if (iVar1 != 2) {
    std::operator<<((ostream *)&std::cout,"call test: step 2 failed!\n");
    uVar2 = uVar2 + 1;
  }
  c.m_empty = false;
  c.m_storage._8_8_ = object::method;
  c.m_storage._16_8_ = 0;
  c.m_deleter = tmf::callable<int(int&,int),32ul>::
                callable<object,int(object::*)(int&,int)>(object&&,int(object::*)(int&,int))::
                {lambda(auto:1)#1}::callable_base<int,int&,int>_const__;
  c.m_caller = tmf::callable<int(int&,int),32ul>::
               callable<object,int(object::*)(int&,int)>(object&&,int(object::*)(int&,int))::
               {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  c.m_copier = tmf::callable<int(int&,int),32ul>::
               callable<object,int(object::*)(int&,int)>(object&&,int(object::*)(int&,int))::
               {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  c.m_mover = tmf::callable<int(int&,int),32ul>::
              callable<object,int(object::*)(int&,int)>(object&&,int(object::*)(int&,int))::
              {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  d.m_deleter = (deleter_function_pointer)CONCAT44(d.m_deleter._4_4_,3);
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)&c,&lvalue,(int *)&d);
  if (iVar1 != 3) {
    std::operator<<((ostream *)&std::cout,"call test: step 3 failed!\n");
    uVar2 = uVar2 + 1;
  }
  d.m_empty = false;
  d.m_storage._0_8_ = &local_45a;
  d.m_storage._8_8_ = object::method;
  d.m_storage._16_8_ = 0;
  d.m_deleter = tmf::callable<int(int&,int),32ul>::
                callable<object&,int(object::*)(int&,int)>(object&,int(object::*)(int&,int))::
                {lambda(auto:1)#1}::callable_base<int,int&,int>_const__;
  d.m_caller = tmf::callable<int(int&,int),32ul>::
               callable<object&,int(object::*)(int&,int)>(object&,int(object::*)(int&,int))::
               {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  d.m_copier = tmf::callable<int(int&,int),32ul>::
               callable<object&,int(object::*)(int&,int)>(object&,int(object::*)(int&,int))::
               {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  d.m_mover = tmf::callable<int(int&,int),32ul>::
              callable<object&,int(object::*)(int&,int)>(object&,int(object::*)(int&,int))::
              {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  e.m_deleter = (deleter_function_pointer)CONCAT44(e.m_deleter._4_4_,4);
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)&d,&lvalue,(int *)&e);
  if (iVar1 != 4) {
    std::operator<<((ostream *)&std::cout,"call test: step 4 failed!\n");
    uVar2 = uVar2 + 1;
  }
  e.m_empty = false;
  e.m_storage._0_8_ = free_function;
  e.m_deleter = (deleter_function_pointer)0x0;
  e.m_caller = tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::
               {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  e.m_copier = tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::
               {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  e.m_mover = tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::
              {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  f.m_deleter = (deleter_function_pointer)CONCAT44(f.m_deleter._4_4_,5);
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)&e,&lvalue,(int *)&f);
  if (iVar1 != 5) {
    std::operator<<((ostream *)&std::cout,"call test: step 5 failed!\n");
    uVar2 = uVar2 + 1;
  }
  f.m_empty = false;
  f.m_storage._0_8_ = object::static_method;
  f.m_deleter = (deleter_function_pointer)0x0;
  f.m_caller = tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::
               {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  f.m_copier = tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::
               {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  f.m_mover = tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::
              {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  g.m_deleter = (deleter_function_pointer)CONCAT44(g.m_deleter._4_4_,6);
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)&f,&lvalue,(int *)&g);
  if (iVar1 != 6) {
    std::operator<<((ostream *)&std::cout,"call test: step 6 failed!\n");
    uVar2 = uVar2 + 1;
  }
  g.m_empty = false;
  g.m_storage._8_8_ =
       tmf::detail::
       member_function<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/ext/callable/tests/call.cpp:64:9),_int_((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/ext/callable/tests/call.cpp:64:9)::*)(int_&,_int)_const,_int,_int_&,_int>
       ::anon_class_1_0_00000001_for_m_object::operator();
  g.m_storage._16_8_ = 0;
  g.m_deleter = tmf::callable<int(int&,int),32ul>::callable<main::$_0>(main::$_0&&)::
                {lambda(auto:1)#1}::callable_base<int,int&,int>_const__;
  g.m_caller = tmf::callable<int(int&,int),32ul>::callable<main::$_0>(main::$_0&&)::
               {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  g.m_copier = tmf::callable<int(int&,int),32ul>::callable<main::$_0>(main::$_0&&)::
               {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  g.m_mover = tmf::callable<int(int&,int),32ul>::callable<main::$_0>(main::$_0&&)::
              {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  h.m_deleter = (deleter_function_pointer)CONCAT44(h.m_deleter._4_4_,7);
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)&g,&lvalue,(int *)&h);
  if (iVar1 != 7) {
    std::operator<<((ostream *)&std::cout,"call test: step 7 failed!\n");
    uVar2 = uVar2 + 1;
  }
  h.m_empty = false;
  h.m_storage._0_8_ = main::anon_class_1_0_00000001::__invoke;
  h.m_deleter = (deleter_function_pointer)0x0;
  h.m_caller = tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::
               {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  h.m_copier = tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::
               {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  h.m_mover = tmf::callable<int(int&,int),32ul>::callable(int(*)(int&,int))::
              {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  i.m_deleter = (deleter_function_pointer)CONCAT44(i.m_deleter._4_4_,8);
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)&h,&lvalue,(int *)&i);
  if (iVar1 != 8) {
    std::operator<<((ostream *)&std::cout,"call test: step 8 failed!\n");
    uVar2 = uVar2 + 1;
  }
  i.m_empty = false;
  i.m_storage._8_8_ =
       tmf::detail::
       member_function<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/ext/callable/tests/call.cpp:72:9),_int_((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/ext/callable/tests/call.cpp:72:9)::*)(int_&,_int)_const,_int,_int_&,_int>
       ::anon_class_8_1_54a39807_for_m_object::operator();
  i.m_storage._16_8_ = 0;
  i.m_deleter = tmf::callable<int(int&,int),32ul>::callable<main::$_2>(main::$_2&&)::
                {lambda(auto:1)#1}::callable_base<int,int&,int>_const__;
  i.m_caller = tmf::callable<int(int&,int),32ul>::callable<main::$_2>(main::$_2&&)::
               {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  i.m_copier = tmf::callable<int(int&,int),32ul>::callable<main::$_2>(main::$_2&&)::
               {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  i.m_mover = tmf::callable<int(int&,int),32ul>::callable<main::$_2>(main::$_2&&)::
              {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  j.m_deleter = (deleter_function_pointer)CONCAT44(j.m_deleter._4_4_,9);
  i.m_storage._0_8_ = &g;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)&i,&lvalue,(int *)&j);
  if (iVar1 != 9) {
    std::operator<<((ostream *)&std::cout,"call test: step 9 failed!\n");
    uVar2 = uVar2 + 1;
  }
  j.m_empty = false;
  j.m_storage._0_8_ = &j_init;
  j.m_storage._8_8_ = functor::operator();
  j.m_storage._16_8_ = 0;
  j.m_deleter = tmf::callable<int(int&,int),32ul>::callable<functor>(functor*)::{lambda(auto:1)#1}::
                callable_base<int,int&,int>_const__;
  j.m_caller = tmf::callable<int(int&,int),32ul>::callable<functor>(functor*)::
               {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  j.m_copier = tmf::callable<int(int&,int),32ul>::callable<functor>(functor*)::
               {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  j.m_mover = tmf::callable<int(int&,int),32ul>::callable<functor>(functor*)::
              {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  k.m_deleter._0_4_ = 10;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)&j,&lvalue,(int *)&k);
  if (iVar1 != 10) {
    std::operator<<((ostream *)&std::cout,"call test: step 10 failed!\n");
    uVar2 = uVar2 + 1;
  }
  std::make_shared<functor>();
  tmf::callable<int_(int_&,_int),_32UL>::callable<functor>(&k,(shared_ptr<functor> *)&l);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&l.m_caller);
  l.m_deleter = (deleter_function_pointer)CONCAT44(l.m_deleter._4_4_,0xb);
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)&k,&lvalue,(int *)&l);
  if (iVar1 != 0xb) {
    std::operator<<((ostream *)&std::cout,"call test: step 11 failed!\n");
    uVar2 = uVar2 + 1;
  }
  l.m_empty = false;
  l.m_storage._0_8_ = &l_init;
  l.m_storage._8_8_ = object::method;
  l.m_storage._16_8_ = 0;
  l.m_deleter = tmf::callable<int(int&,int),32ul>::
                callable<object,int(object::*)(int&,int)>(object*,int(object::*)(int&,int))::
                {lambda(auto:1)#1}::callable_base<int,int&,int>_const__;
  l.m_caller = tmf::callable<int(int&,int),32ul>::
               callable<object,int(object::*)(int&,int)>(object*,int(object::*)(int&,int))::
               {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int&,int>_const__int__int_;
  l.m_copier = tmf::callable<int(int&,int),32ul>::
               callable<object,int(object::*)(int&,int)>(object*,int(object::*)(int&,int))::
               {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int&,int>_const__;
  l.m_mover = tmf::callable<int(int&,int),32ul>::
              callable<object,int(object::*)(int&,int)>(object*,int(object::*)(int&,int))::
              {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int&,int>___;
  m.m_deleter._0_4_ = 0xc;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)&l,&lvalue,(int *)&m);
  if (iVar1 != 0xc) {
    std::operator<<((ostream *)&std::cout,"call test: step 12 failed!\n");
    uVar2 = uVar2 + 1;
  }
  std::make_shared<object>();
  tmf::callable<int(int&,int),32ul>::callable<object,int(object::*)(int&,int)>
            ((callable<int(int&,int),32ul> *)&m,&local_458,0x102c74);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_458.super___shared_ptr<object,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_458.super___shared_ptr<object,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0xd;
  iVar1 = tmf::callable<int(int&,int),32ul>::operator()
                    ((callable<int(int&,int),32ul> *)&m,&lvalue,(int *)&local_458);
  if (iVar1 != 0xd) {
    std::operator<<((ostream *)&std::cout,"call test: step 13 failed!\n");
    uVar2 = uVar2 + 1;
  }
  tmf::callable<int_(int_&,_int),_32UL>::~callable(&m);
  tmf::callable<int_(int_&,_int),_32UL>::~callable(&l);
  tmf::callable<int_(int_&,_int),_32UL>::~callable(&k);
  tmf::callable<int_(int_&,_int),_32UL>::~callable(&j);
  tmf::callable<int_(int_&,_int),_32UL>::~callable(&i);
  tmf::callable<int_(int_&,_int),_32UL>::~callable(&h);
  tmf::callable<int_(int_&,_int),_32UL>::~callable(&g);
  tmf::callable<int_(int_&,_int),_32UL>::~callable(&f);
  tmf::callable<int_(int_&,_int),_32UL>::~callable(&e);
  tmf::callable<int_(int_&,_int),_32UL>::~callable(&d);
  tmf::callable<int_(int_&,_int),_32UL>::~callable(&c);
  tmf::callable<int_(int_&,_int),_32UL>::~callable(&b);
  tmf::callable<int_(int_&,_int),_32UL>::~callable(&a);
  return uVar2;
}

Assistant:

int
main()
{
		using fn = tmf::callable<int(int&, int)>;
		int failures = 0;
		int lvalue = 0;

		// to initialize with a functor, provide a class instance
		// - you can provide an rvalue to have your instance possibly moved into the callable
		fn a{ functor{} };
		a(lvalue, 1) == 1 ? 0 : (std::cout << "call test: step 1 failed!\n", ++failures);

		// - you can provide an lvalue to have your instance copied into the callable
		functor b_init{};
		fn b{ b_init };
		b(lvalue, 2) == 2 ? 0 : (std::cout << "call test: step 2 failed!\n", ++failures);

		// to initialize with an arbitrary member function provide a class instance
		// and a pointer to member function
		// - you can provide an rvalue to have your instance possibly moved into the callable
		fn c{ object{}, &object::method };
		c(lvalue, 3) == 3 ? 0 : (std::cout << "call test: step 3 failed!\n", ++failures);

		// - you can provide an lvalue to have your instance copied into the callable
		object d_init{};
		fn d{ d_init, &object::method };
		d(lvalue, 4) == 4 ? 0 : (std::cout << "call test: step 4 failed!\n", ++failures);

		// to initialize with a free function, provide the address of a
		// free function or static member function
		fn e{ &free_function };
		e(lvalue, 5) == 5 ? 0 : (std::cout << "call test: step 5 failed!\n", ++failures);

		fn f{ &object::static_method };
		f(lvalue, 6) == 6 ? 0 : (std::cout << "call test: step 6 failed!\n", ++failures);

		// to initialize with a lambda, simply provide the lambda
		fn g{ [](int& out, int i) { out += 1; return i; } };
		g(lvalue, 7) == 7 ? 0 : (std::cout << "call test: step 7 failed!\n", ++failures);

		// if the lambda can be downcast to a function pointer, this can reduce the size of the stored callable
		fn h{ static_cast<int(*)(int&, int)>([](int& out, int i) { out += 1; return i; }) };
		h(lvalue, 8) == 8 ? 0 : (std::cout << "call test: step 8 failed!\n", ++failures);

		// lambdas can capture, but keep in mind how this might effect the size of the callable
		fn i{ [&g](int& out, int value) { return g(out, value); } };
		i(lvalue, 9) == 9 ? 0 : (std::cout << "call test: step 9 failed!\n", ++failures);

		// initialize with a raw pointer to avoid copies and moves
		functor j_init;
		fn j{ &j_init };
		j(lvalue, 10) == 10 ? 0 : (std::cout << "call test: step 10 failed!\n", ++failures);

		// shared_ptr is a safer way to avoid copies and moves
		fn k{ std::make_shared<functor>() };
		k(lvalue, 11) == 11 ? 0 : (std::cout << "call test: step 11 failed!\n", ++failures);

		// initialize with a raw pointer to avoid copies and moves
		object l_init;
		fn l{ &l_init, &object::method };
		l(lvalue, 12) == 12 ? 0 : (std::cout << "call test: step 12 failed!\n", ++failures);

		// shared_ptr is a safer way to avoid copies and moves
		fn m{ std::make_shared<object>(), &object::method };
		m(lvalue, 13) == 13 ? 0 : (std::cout << "call test: step 13 failed!\n", ++failures);

		return failures;
}